

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

void __thiscall tinygltf::Asset::Asset(Asset *this)

{
  allocator local_11;
  Asset *local_10;
  Asset *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,"2.0",&local_11);
  std::allocator<char>::~allocator((allocator<char> *)&local_11);
  std::__cxx11::string::string((string *)&this->generator);
  std::__cxx11::string::string((string *)&this->minVersion);
  std::__cxx11::string::string((string *)&this->copyright);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>_>
  ::map(&this->extensions);
  Value::Value(&this->extras);
  std::__cxx11::string::string((string *)&this->extras_json_string);
  std::__cxx11::string::string((string *)&this->extensions_json_string);
  return;
}

Assistant:

Asset() = default;